

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt-node.h
# Opt level: O2

void __thiscall mp::pre::ValueNode::ValueNode(ValueNode *this,BasicValuePresolver *pre,string *nm)

{
  this->pre_ = pre;
  (this->vi_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (this->vi_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->vi_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->vd_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->vd_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->vd_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->vStr_).super__Vector_base<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vStr_).super__Vector_base<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vStr_).super__Vector_base<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->sz_ = 0;
  std::__cxx11::string::string((string *)&this->name_,(string *)nm);
  (*this->pre_->_vptr_BasicValuePresolver[0x10])(this->pre_,this);
  return;
}

Assistant:

ValueNode(BasicValuePresolver& pre, std::string nm={}) :
    pre_(pre), name_(nm) { RegisterMe(); }